

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O2

int UnityEnd(void)

{
  char *string;
  
  putchar(10);
  UnityPrint("-----------------------");
  putchar(10);
  UnityPrintNumber(Unity.NumberOfTests);
  UnityPrint(" Tests ");
  UnityPrintNumber(CONCAT44(Unity.TestFailures._4_4_,(int)Unity.TestFailures));
  UnityPrint(" Failures ");
  UnityPrintNumber(Unity.TestIgnores);
  UnityPrint(" Ignored ");
  putchar(10);
  string = "FAIL";
  if (CONCAT44(Unity.TestFailures._4_4_,(int)Unity.TestFailures) == 0) {
    string = "OK";
  }
  UnityPrint(string);
  putchar(10);
  return (int)Unity.TestFailures;
}

Assistant:

int UnityEnd(void)
{
    UNITY_PRINT_EOL();
    UnityPrint(UnityStrBreaker);
    UNITY_PRINT_EOL();
    UnityPrintNumber((UNITY_INT)(Unity.NumberOfTests));
    UnityPrint(UnityStrResultsTests);
    UnityPrintNumber((UNITY_INT)(Unity.TestFailures));
    UnityPrint(UnityStrResultsFailures);
    UnityPrintNumber((UNITY_INT)(Unity.TestIgnores));
    UnityPrint(UnityStrResultsIgnored);
    UNITY_PRINT_EOL();
    if (Unity.TestFailures == 0U)
    {
        UnityPrint(UnityStrOk);
    }
    else
    {
        UnityPrint(UnityStrFail);
#ifdef UNITY_DIFFERENTIATE_FINAL_FAIL
        UNITY_OUTPUT_CHAR('E'); UNITY_OUTPUT_CHAR('D');
#endif
    }
    UNITY_PRINT_EOL();
    UNITY_FLUSH_CALL();
    UNITY_OUTPUT_COMPLETE();
    return (int)(Unity.TestFailures);
}